

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resWin.c
# Opt level: O2

int Res_WinMarkPaths_rec(Abc_Obj_t *pNode,Abc_Obj_t *pPivot,int nLevelMin)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  
  iVar1 = Abc_NodeIsTravIdCurrent(pNode);
  if (iVar1 == 0) {
    iVar1 = Abc_NodeIsTravIdPrevious(pNode);
    uVar4 = 0;
    if (iVar1 == 0) {
      Abc_NodeSetTravId(pNode,pNode->pNtk->nTravIds + -1);
      uVar4 = 0;
      if ((pNode != pPivot) && (nLevelMin < (int)(*(uint *)&pNode->field_0x14 >> 0xc))) {
        if ((*(uint *)&pNode->field_0x14 & 0xf) != 7) {
          __assert_fail("Abc_ObjIsNode(pNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/res/resWin.c"
                        ,0x105,"int Res_WinMarkPaths_rec(Abc_Obj_t *, Abc_Obj_t *, int)");
        }
        uVar4 = 0;
        for (lVar3 = 0; lVar3 < (pNode->vFanins).nSize; lVar3 = lVar3 + 1) {
          uVar2 = Res_WinMarkPaths_rec
                            ((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar3]]
                             ,pPivot,nLevelMin);
          uVar4 = uVar4 | uVar2;
        }
        if (uVar4 == 0) {
          uVar4 = 0;
        }
        else {
          Abc_NodeSetTravIdCurrent(pNode);
        }
      }
    }
  }
  else {
    uVar4 = 1;
  }
  return uVar4;
}

Assistant:

int Res_WinMarkPaths_rec( Abc_Obj_t * pNode, Abc_Obj_t * pPivot, int nLevelMin )
{
    Abc_Obj_t * pFanin;
    int i, RetValue;
    // skip visited nodes
    if ( Abc_NodeIsTravIdCurrent(pNode) )
        return 1;
    if ( Abc_NodeIsTravIdPrevious(pNode) )
        return 0;
    // assume that the node does not have access to the leaves
    Abc_NodeSetTravIdPrevious( pNode );
    // skip nodes below the given level
    if ( pNode == pPivot || (int)pNode->Level <= nLevelMin )
        return 0;
    assert( Abc_ObjIsNode(pNode) );
    // check if the fanins have access to the leaves
    RetValue = 0;
    Abc_ObjForEachFanin( pNode, pFanin, i )
        RetValue |= Res_WinMarkPaths_rec( pFanin, pPivot, nLevelMin );
    // relabel the node if it has access to the leaves
    if ( RetValue )
        Abc_NodeSetTravIdCurrent( pNode );
    return RetValue;
}